

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DTDScanner::checkForPERef(DTDScanner *this,bool inLiteral,bool inMarkup)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ReaderMgr::skippedSpace(this->fReaderMgr);
  if (bVar1) {
    ReaderMgr::skipPastSpaces(this->fReaderMgr);
  }
  bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
  if (bVar2) {
    do {
      bVar2 = expandPERef(this,false,inLiteral,inMarkup,false);
      if (!bVar2) {
        XMLScanner::emitError(this->fScanner,ExpectedEntityRefName);
      }
      bVar2 = ReaderMgr::skippedSpace(this->fReaderMgr);
      if (bVar2) {
        ReaderMgr::skipPastSpaces(this->fReaderMgr);
        bVar1 = true;
      }
      bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'%');
    } while (bVar2);
  }
  return bVar1;
}

Assistant:

bool DTDScanner::checkForPERef(   const bool    inLiteral
                                , const bool    inMarkup)
{
    bool gotSpace = false;

    //
    //  See if we have any spaces up front. If so, then skip them and set
    //  the gotSpaces flag.
    //
    if (fReaderMgr->skippedSpace())
    {
        fReaderMgr->skipPastSpaces();
        gotSpace = true;
    }

    // If the next char is a percent, then expand the PERef
    if (!fReaderMgr->skippedChar(chPercent))
       return gotSpace;

    while (true)
    {
       if (!expandPERef(false, inLiteral, inMarkup, false))
          fScanner->emitError(XMLErrs::ExpectedEntityRefName);
       // And skip any more spaces in the expanded value
       if (fReaderMgr->skippedSpace())
       {
          fReaderMgr->skipPastSpaces();
          gotSpace = true;
       }
       if (!fReaderMgr->skippedChar(chPercent))
          break;
    }
    return gotSpace;
}